

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::StringToULong(char *str,unsigned_long *value)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  char *__nptr;
  bool bVar5;
  char *endp;
  char *local_30;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  __nptr = str + -1;
  do {
    cVar1 = __nptr[1];
    __nptr = __nptr + 1;
    iVar2 = isspace((int)cVar1);
  } while (iVar2 != 0);
  if (cVar1 == '-') {
    bVar5 = false;
  }
  else {
    uVar4 = strtoul(__nptr,&local_30,10);
    *value = uVar4;
    bVar5 = false;
    if ((__nptr != local_30) && (*local_30 == '\0')) {
      bVar5 = *piVar3 == 0;
    }
  }
  return bVar5;
}

Assistant:

bool cmSystemTools::StringToULong(const char* str, unsigned long* value)
{
  errno = 0;
  char* endp;
  while (isspace(*str)) {
    ++str;
  }
  if (*str == '-') {
    return false;
  }
  *value = strtoul(str, &endp, 10);
  return (*endp == '\0') && (endp != str) && (errno == 0);
}